

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

UINT8 ym2203_timer_over(void *chip,UINT8 c)

{
  byte bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,c) == 0) {
    ym2203_update_one(chip,0,(DEV_SMPL **)0x0);
    if ((*(byte *)((long)chip + 0x130) & 4) != 0) {
      bVar1 = *(byte *)((long)chip + 0x12f) | 1;
      *(byte *)((long)chip + 0x12f) = bVar1;
      if ((*(char *)((long)chip + 0x12d) == '\0') && ((*(byte *)((long)chip + 0x12e) & bVar1) != 0))
      {
        *(undefined1 *)((long)chip + 0x12d) = 1;
        if (*(code **)((long)chip + 0x550) != (code *)0x0) {
          (**(code **)((long)chip + 0x550))(*(undefined8 *)((long)chip + 0x110),1);
        }
      }
    }
    iVar2 = 0x400 - *(int *)((long)chip + 0x138);
    *(int *)((long)chip + 0x13c) = iVar2;
    if (*(code **)((long)chip + 0x548) != (code *)0x0) {
      (**(code **)((long)chip + 0x548))
                (*(undefined8 *)((long)chip + 0x110),0,iVar2 * *(int *)((long)chip + 0x128),
                 *(undefined4 *)((long)chip + 0x118));
      iVar2 = *(int *)((long)chip + 0x13c);
    }
    *(int *)((long)chip + 0x13c) = iVar2 << 0xc;
    if ((*(uint *)((long)chip + 0x130) & 0xc0) == 0x80) {
      CSMKeyControl((FM_OPN *)((long)chip + 0x108),(FM_CH *)((long)chip + 0x49a8));
    }
  }
  else {
    if ((*(byte *)((long)chip + 0x130) & 8) != 0) {
      bVar1 = *(byte *)((long)chip + 0x12f) | 2;
      *(byte *)((long)chip + 0x12f) = bVar1;
      if ((*(char *)((long)chip + 0x12d) == '\0') && ((*(byte *)((long)chip + 0x12e) & bVar1) != 0))
      {
        *(undefined1 *)((long)chip + 0x12d) = 1;
        if (*(code **)((long)chip + 0x550) != (code *)0x0) {
          (**(code **)((long)chip + 0x550))(*(undefined8 *)((long)chip + 0x110),1);
        }
      }
    }
    iVar2 = (uint)*(byte *)((long)chip + 0x140) * -0x10 + 0x1000;
    *(int *)((long)chip + 0x144) = iVar2;
    if (*(code **)((long)chip + 0x548) != (code *)0x0) {
      (**(code **)((long)chip + 0x548))
                (*(undefined8 *)((long)chip + 0x110),1,iVar2 * *(int *)((long)chip + 0x128),
                 *(undefined4 *)((long)chip + 0x118));
      iVar2 = *(int *)((long)chip + 0x144);
    }
    *(int *)((long)chip + 0x144) = iVar2 << 0xc;
  }
  return *(UINT8 *)((long)chip + 0x12d);
}

Assistant:

UINT8 ym2203_timer_over(void *chip,UINT8 c)
{
	YM2203 *F2203 = (YM2203 *)chip;

	if( c )
	{   /* Timer B */
		TimerBOver( &(F2203->OPN.ST) );
	}
	else
	{   /* Timer A */
		ym2203_update_req(F2203);
		/* timer update */
		TimerAOver( &(F2203->OPN.ST) );
		/* CSM mode key,TL control */
		if ((F2203->OPN.ST.mode & 0xc0) == 0x80)
		{   /* CSM mode total level latch and auto key on */
			CSMKeyControl( &F2203->OPN, &(F2203->CH[2]) );
		}
	}
	return F2203->OPN.ST.irq;
}